

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *printer)

{
  MessageGenerator *this_00;
  bool bVar1;
  FieldGenerator *pFVar2;
  Descriptor *pDVar3;
  undefined1 qualified;
  string *in_RCX;
  int i;
  FieldDescriptor *field;
  cpp *this_01;
  long lVar4;
  long lVar5;
  string local_98;
  string local_78;
  MessageGenerator *local_58;
  string local_50;
  
  qualified = SUB81(in_RCX,0);
  pDVar3 = this->descriptor_;
  if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6b) == '\x01') {
    if ((this->options_).enforce_lite != false) {
      return;
    }
    if (*(int *)(*(long *)(*(long *)(pDVar3 + 0x10) + 0xa0) + 0xa8) == 3) {
      return;
    }
    FileLevelNamespace(&local_98,(string *)**(undefined8 **)(pDVar3 + 0x10));
    ClassName_abi_cxx11_
              (&local_78,*(cpp **)(this->descriptor_ + 0x18),(Descriptor *)0x0,(bool)qualified);
    SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)(uint)this->index_in_file_messages_,i);
    io::Printer::Print(printer,
                       "$parent$::$classname$::$classname$() {}\n$parent$::$classname$::$classname$(::google::protobuf::Arena* arena) : SuperType(arena) {}\n::google::protobuf::Metadata $parent$::$classname$::GetMetadata() const {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_metadata[$index$];\n}\nvoid $parent$::$classname$::MergeFrom(\n    const ::google::protobuf::Message& other) {\n  ::google::protobuf::Message::MergeFrom(other);\n}\nvoid $parent$::$classname$::MergeFrom(const $classname$& other) {\n  MergeFromInternal(other);\n}\n\n"
                       ,"file_namespace",&local_98,"parent",&local_78,"classname",&this->classname_,
                       "index",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = IsAnyMessage(pDVar3);
    if (bVar1) {
      in_RCX = &this->classname_;
      io::Printer::Print(printer,
                         "void $classname$::PackFrom(const ::google::protobuf::Message& message) {\n  _any_metadata_.PackFrom(message);\n}\n\nvoid $classname$::PackFrom(const ::google::protobuf::Message& message,\n                           const ::std::string& type_url_prefix) {\n  _any_metadata_.PackFrom(message, type_url_prefix);\n}\n\nbool $classname$::UnpackTo(::google::protobuf::Message* message) const {\n  return _any_metadata_.UnpackTo(message);\n}\n\n"
                         ,"classname",in_RCX);
    }
    pDVar3 = this->descriptor_;
    if (0 < *(int *)(pDVar3 + 0x2c)) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        pFVar2 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar3 + 0x30) + lVar5));
        (*pFVar2->_vptr_FieldGenerator[8])(pFVar2,printer);
        lVar4 = lVar4 + 1;
        pDVar3 = this->descriptor_;
        in_RCX = (string *)(long)*(int *)(pDVar3 + 0x2c);
        lVar5 = lVar5 + 0xa8;
      } while (lVar4 < (long)in_RCX);
    }
    io::Printer::Print(printer,"#if !defined(_MSC_VER) || _MSC_VER >= 1900\n");
    pDVar3 = this->descriptor_;
    local_58 = this;
    if (0 < *(int *)(pDVar3 + 0x2c)) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        this_01 = (cpp *)(*(long *)(pDVar3 + 0x30) + lVar4);
        ClassName_abi_cxx11_
                  (&local_98,
                   *(cpp **)(this_01 +
                            (ulong)*(byte *)(*(long *)(pDVar3 + 0x30) + 0x50 + lVar4) * 0x10 + 0x58)
                   ,(Descriptor *)0x0,SUB81(in_RCX,0));
        FieldConstantName_abi_cxx11_(&local_78,this_01,field);
        io::Printer::Print(printer,"const int $classname$::$constant_name$;\n","classname",&local_98
                           ,"constant_name",&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        lVar5 = lVar5 + 1;
        pDVar3 = local_58->descriptor_;
        in_RCX = (string *)(long)*(int *)(pDVar3 + 0x2c);
        lVar4 = lVar4 + 0xa8;
      } while (lVar5 < (long)in_RCX);
    }
    io::Printer::Print(printer,"#endif  // !defined(_MSC_VER) || _MSC_VER >= 1900\n\n");
    this_00 = local_58;
    GenerateStructors(local_58,printer);
    io::Printer::Print(printer,"\n");
    if (0 < *(int *)(this_00->descriptor_ + 0x38)) {
      GenerateOneofClear(this_00,printer);
      io::Printer::Print(printer,"\n");
    }
    if (((this_00->options_).enforce_lite != false) ||
       (*(int *)(*(long *)(*(long *)(this_00->descriptor_ + 0x10) + 0xa0) + 0xa8) != 2)) {
      GenerateClear(this_00,printer);
      io::Printer::Print(printer,"\n");
      GenerateMergeFromCodedStream(this_00,printer);
      io::Printer::Print(printer,"\n");
      GenerateSerializeWithCachedSizes(this_00,printer);
      io::Printer::Print(printer,"\n");
      if (((this_00->options_).enforce_lite == false) &&
         (*(int *)(*(long *)(*(long *)(this_00->descriptor_ + 0x10) + 0xa0) + 0xa8) == 1)) {
        GenerateSerializeWithCachedSizesToArray(this_00,printer);
        io::Printer::Print(printer,"\n");
      }
      GenerateByteSize(this_00,printer);
      io::Printer::Print(printer,"\n");
      GenerateMergeFrom(this_00,printer);
      io::Printer::Print(printer,"\n");
      GenerateCopyFrom(this_00,printer);
      io::Printer::Print(printer,"\n");
      GenerateIsInitialized(this_00,printer);
      io::Printer::Print(printer,"\n");
    }
    GenerateSwap(this_00,printer);
    io::Printer::Print(printer,"\n");
    pDVar3 = this_00->descriptor_;
    if (((this_00->options_).enforce_lite != false) ||
       (*(int *)(*(long *)(*(long *)(pDVar3 + 0x10) + 0xa0) + 0xa8) == 3)) {
      io::Printer::Print(printer,
                         "::std::string $classname$::GetTypeName() const {\n  return \"$type_name$\";\n}\n\n"
                         ,"classname",&this_00->classname_,"type_name",*(string **)(pDVar3 + 8));
      return;
    }
    FileLevelNamespace(&local_98,(string *)**(undefined8 **)(pDVar3 + 0x10));
    io::Printer::Print(printer,
                       "::google::protobuf::Metadata $classname$::GetMetadata() const {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_metadata[kIndexInFileMessages];\n}\n\n"
                       ,"classname",&this_00->classname_,"file_namespace",&local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateClassMethods(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) {
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      printer->Print(
          "$parent$::$classname$::$classname$() {}\n"
          "$parent$::$classname$::$classname$(::google::protobuf::Arena* arena) : "
          "SuperType(arena) {}\n"
          "::google::protobuf::Metadata $parent$::$classname$::GetMetadata() const {\n"
          "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
          "  return $file_namespace$::file_level_metadata[$index$];\n"
          "}\n"
          "void $parent$::$classname$::MergeFrom(\n"
          "    const ::google::protobuf::Message& other) {\n"
          "  ::google::protobuf::Message::MergeFrom(other);\n"
          "}\n"
          "void $parent$::$classname$::MergeFrom(const $classname$& other) {\n"
          "  MergeFromInternal(other);\n"
          "}\n"
          "\n",
          "file_namespace", FileLevelNamespace(descriptor_->file()->name()),
          "parent", ClassName(descriptor_->containing_type(), false),
          "classname", classname_, "index",
          SimpleItoa(index_in_file_messages_));
    }
    return;
  }

  if (IsAnyMessage(descriptor_)) {
    printer->Print(
      "void $classname$::PackFrom(const ::google::protobuf::Message& message) {\n"
      "  _any_metadata_.PackFrom(message);\n"
      "}\n"
      "\n"
      "void $classname$::PackFrom(const ::google::protobuf::Message& message,\n"
      "                           const ::std::string& type_url_prefix) {\n"
      "  _any_metadata_.PackFrom(message, type_url_prefix);\n"
      "}\n"
      "\n"
      "bool $classname$::UnpackTo(::google::protobuf::Message* message) const {\n"
      "  return _any_metadata_.UnpackTo(message);\n"
      "}\n"
      "\n",
      "classname", classname_);
  }

  // Generate non-inline field definitions.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateNonInlineAccessorDefinitions(printer);
  }

  // Generate field number constants.
  printer->Print("#if !defined(_MSC_VER) || _MSC_VER >= 1900\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor *field = descriptor_->field(i);
    printer->Print(
      "const int $classname$::$constant_name$;\n",
      "classname", ClassName(FieldScope(field), false),
      "constant_name", FieldConstantName(field));
  }
  printer->Print(
    "#endif  // !defined(_MSC_VER) || _MSC_VER >= 1900\n"
    "\n");

  GenerateStructors(printer);
  printer->Print("\n");

  if (descriptor_->oneof_decl_count() > 0) {
    GenerateOneofClear(printer);
    printer->Print("\n");
  }

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    GenerateClear(printer);
    printer->Print("\n");

    GenerateMergeFromCodedStream(printer);
    printer->Print("\n");

    GenerateSerializeWithCachedSizes(printer);
    printer->Print("\n");

    if (HasFastArraySerialization(descriptor_->file(), options_)) {
      GenerateSerializeWithCachedSizesToArray(printer);
      printer->Print("\n");
    }

    GenerateByteSize(printer);
    printer->Print("\n");

    GenerateMergeFrom(printer);
    printer->Print("\n");

    GenerateCopyFrom(printer);
    printer->Print("\n");

    GenerateIsInitialized(printer);
    printer->Print("\n");
  }

  GenerateSwap(printer);
  printer->Print("\n");

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    printer->Print(
        "::google::protobuf::Metadata $classname$::GetMetadata() const {\n"
        "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
        "  return "
        "$file_namespace$::file_level_metadata[kIndexInFileMessages];\n"
        "}\n"
        "\n",
        "classname", classname_, "file_namespace",
        FileLevelNamespace(descriptor_->file()->name()));
  } else {
    printer->Print(
      "::std::string $classname$::GetTypeName() const {\n"
      "  return \"$type_name$\";\n"
      "}\n"
      "\n",
      "classname", classname_,
      "type_name", descriptor_->full_name());
  }

}